

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z-bitflag.c
# Opt level: O0

_Bool flag_has_dbg(bitflag *flags,size_t size,int flag,char *fi,char *fl)

{
  uint uVar1;
  ulong uVar2;
  int flag_binary;
  size_t flag_offset;
  char *fl_local;
  char *fi_local;
  int flag_local;
  size_t size_local;
  bitflag *flags_local;
  
  uVar2 = (ulong)(long)(flag + -1) >> 3;
  uVar1 = 1 << ((char)flag - 1U & 7);
  if (flag == 0) {
    flags_local._7_1_ = false;
  }
  else {
    if (size <= uVar2) {
      quit_fmt("Error in flag_has(%s, %s): FlagID[%d] Size[%u] FlagOff[%u] FlagBV[%d]\n",fi,fl,
               (ulong)(uint)flag,size & 0xffffffff,uVar2 & 0xffffffff,uVar1);
    }
    if ((flags[uVar2] & uVar1) == 0) {
      flags_local._7_1_ = false;
    }
    else {
      flags_local._7_1_ = true;
    }
  }
  return flags_local._7_1_;
}

Assistant:

bool flag_has_dbg(const bitflag *flags, const size_t size, const int flag,
				  const char *fi, const char *fl)
{
	const size_t flag_offset = FLAG_OFFSET(flag);
	const int flag_binary = FLAG_BINARY(flag);

	if (flag == FLAG_END) return false;

	if (flag_offset >= size) {
		quit_fmt("Error in flag_has(%s, %s): FlagID[%d] Size[%u] FlagOff[%u] FlagBV[%d]\n",
		         fi, fl, flag, (unsigned int) size, (unsigned int) flag_offset, flag_binary);
	}

	if (flags[flag_offset] & flag_binary) return true;

	return false;
}